

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parsed_expression.cpp
# Opt level: O3

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ConstantExpression::Deserialize(ConstantExpression *this,Deserializer *deserializer)

{
  ConstantExpression *this_00;
  pointer pCVar1;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ConstantExpression_*,_false> local_68;
  Value local_60;
  
  this_00 = (ConstantExpression *)operator_new(0x78);
  ConstantExpression(this_00);
  local_68._M_head_impl = this_00;
  pCVar1 = unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
           ::operator->((unique_ptr<duckdb::ConstantExpression,_std::default_delete<duckdb::ConstantExpression>,_true>
                         *)&local_68);
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"value");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_60,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  Value::operator=(&pCVar1->value,&local_60);
  Value::~Value(&local_60);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)local_68._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> ConstantExpression::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<ConstantExpression>(new ConstantExpression());
	deserializer.ReadProperty<Value>(200, "value", result->value);
	return std::move(result);
}